

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<bidfx_public_api::SubscriptionStatus>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  iterator it;
  iterator iVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined1 local_54;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  local_68 = 0x2000000000;
  uStack_60 = 0;
  local_58 = 0xffffffff;
  local_54 = 0;
  local_50 = 0;
  local_48 = 0;
  local_38 = 0;
  local_30 = 0;
  it = formatter<fmt::v5::basic_string_view<char>,char,void>::
       parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
                 ((formatter<fmt::v5::basic_string_view<char>,char,void> *)&local_68,
                  (basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx,it);
  iVar1 = formatter<bidfx_public_api::SubscriptionStatus,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<bidfx_public_api::SubscriptionStatus,char,void> *)&local_68,
                     (SubscriptionStatus *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = iVar1.container;
  return;
}

Assistant:

basic_format_args(const format_arg *args, size_type count)
  : types_(-static_cast<int64_t>(count)) {
    set_data(args);
  }